

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall
ktx::DiffEnum<_khr_df_primaries_e>::DiffEnum
          (DiffEnum<_khr_df_primaries_e> *this,string_view textHeaderIn,string_view jsonPathIn,
          optional<int> *value1,optional<int> *value2,function<const_char_*(unsigned_long)> *strFunc
          )

{
  char *pcVar1;
  _Storage<_khr_df_primaries_e,_true> local_30;
  undefined1 local_2c;
  _Storage<_khr_df_primaries_e,_true> local_28;
  undefined1 local_24;
  
  local_2c = (value1->super__Optional_base<int,_true,_true>)._M_payload.
             super__Optional_payload_base<int>._M_engaged == true;
  if ((bool)local_2c) {
    local_30 = *(_Storage<_khr_df_primaries_e,_true> *)
                &(value1->super__Optional_base<int,_true,_true>)._M_payload.
                 super__Optional_payload_base<int>._M_payload;
  }
  local_24 = (value2->super__Optional_base<int,_true,_true>)._M_payload.
             super__Optional_payload_base<int>._M_engaged == true;
  if ((bool)local_24) {
    local_28 = *(_Storage<_khr_df_primaries_e,_true> *)
                &(value2->super__Optional_base<int,_true,_true>)._M_payload.
                 super__Optional_payload_base<int>._M_payload;
  }
  DiffBase<_khr_df_primaries_e>::DiffBase
            (&this->super_DiffBase<_khr_df_primaries_e>,textHeaderIn,jsonPathIn,
             (optional<_khr_df_primaries_e> *)&local_30,(optional<_khr_df_primaries_e> *)&local_28);
  (this->super_DiffBase<_khr_df_primaries_e>)._vptr_DiffBase =
       (_func_int **)&PTR_value_abi_cxx11__00241558;
  (this->super_DiffBase<_khr_df_primaries_e>).field_0x39 = 0;
  this->enumNames[0] = (char *)0x0;
  this->enumNames[1] = (char *)0x0;
  if ((value1->super__Optional_base<int,_true,_true>)._M_payload.super__Optional_payload_base<int>.
      _M_engaged == true) {
    pcVar1 = std::function<const_char_*(unsigned_long)>::operator()(strFunc,0);
    this->enumNames[0] = pcVar1;
  }
  if ((value2->super__Optional_base<int,_true,_true>)._M_payload.super__Optional_payload_base<int>.
      _M_engaged == true) {
    pcVar1 = std::function<const_char_*(unsigned_long)>::operator()(strFunc,1);
    this->enumNames[1] = pcVar1;
  }
  return;
}

Assistant:

DiffEnum(const std::string_view textHeaderIn, const std::string_view jsonPathIn,
        const std::optional<int32_t>& value1, const std::optional<int32_t>& value2,
        const std::function<const char*(std::size_t)>& strFunc)
        : DiffBase<T>(textHeaderIn, jsonPathIn,
            value1.has_value() ? T(*value1) : std::optional<T>(),
            value2.has_value() ? T(*value2) : std::optional<T>()) {
        if (value1.has_value()) enumNames[0] = strFunc(0);
        if (value2.has_value()) enumNames[1] = strFunc(1);
    }